

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

JointActionDiscrete * __thiscall
MADPComponentDiscreteActions::GetJointActionDiscrete(MADPComponentDiscreteActions *this,Index i)

{
  pointer ppJVar1;
  ostream *poVar2;
  E *pEVar3;
  stringstream ss;
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_188,"MADPComponentDiscreteActions::GetJointActionDiscrete(");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,") - Error: not initialized. ");
    std::endl<char,std::char_traits<char>>(poVar2);
    pEVar3 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar3,&ss);
    __cxa_throw(pEVar3,&E::typeinfo,E::~E);
  }
  if (this->_m_cachedAllJointActions != false) {
    ppJVar1 = (this->_m_jointActionVec).
              super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)i <
        (ulong)((long)(this->_m_jointActionVec).
                      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3)) {
      return ppJVar1[i];
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_188,
                             "WARNING MADPComponentDiscreteActions::GetJointActionDiscrete(Index i) index a out of bounds"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    pEVar3 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar3,&ss);
    __cxa_throw(pEVar3,&E::typeinfo,E::~E);
  }
  pEVar3 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar3,
       "MADPComponentDiscreteActions::GetJointActionDiscrete: joint actions have not been created");
  __cxa_throw(pEVar3,&E::typeinfo,E::~E);
}

Assistant:

const JointActionDiscrete* MADPComponentDiscreteActions::GetJointActionDiscrete(Index i) const
{
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "MADPComponentDiscreteActions::GetJointActionDiscrete("<< 
            i<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(!_m_cachedAllJointActions)
    {
        throw E("MADPComponentDiscreteActions::GetJointActionDiscrete: joint actions have not been created");
    }
    if(i < _m_jointActionVec.size() )
    {
        const JointActionDiscrete* j = _m_jointActionVec[i];
        return( j );
    }
    //else        
    stringstream ss;
    ss << "WARNING MADPComponentDiscreteActions::GetJointActionDiscrete(Index i) index a out of bounds"<<endl;
    throw E(ss);
}